

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O1

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitTypedArrayIndex
          (AsmJSByteCodeGenerator *this,ParseNode *indexNode,OpCodeAsmJs *op,uint32 *indexSlot,
          ViewType viewType,TypedArrayEmitType emitType)

{
  undefined1 *puVar1;
  OpCode OVar2;
  AsmJsModuleCompiler *pAVar3;
  ParseNode *this_00;
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  IdentPtr pIVar8;
  AsmJsSymbol *pAVar9;
  ParseNodeInt *pPVar10;
  ParseNodeBin *pPVar11;
  ParseNodeFloat *pPVar12;
  EmitExpressionInfo EVar13;
  undefined4 *puVar14;
  AsmJsVar *pAVar15;
  char16 *pcVar16;
  AsmJsCompilationException *this_01;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  EmitExpressionInfo local_58;
  EmitExpressionInfo indexInfo;
  EmitExpressionInfo local_48;
  EmitExpressionInfo indexInfo_1;
  uint local_34;
  
  puVar1 = &this->mCompiler->field_0x2e4;
  *puVar1 = *puVar1 | 0x10;
  uVar18 = 0;
  bVar6 = false;
  indexInfo = (EmitExpressionInfo)indexSlot;
  indexInfo_1 = (EmitExpressionInfo)op;
  if (indexNode->nop == knopName) {
    pAVar3 = this->mCompiler;
    pIVar8 = ParseNode::name(indexNode);
    pAVar9 = AsmJsModuleCompiler::LookupIdentifier(pAVar3,pIVar8,this->mFunction,(Source *)0x0);
    if (pAVar9 == (AsmJsSymbol *)0x0) {
LAB_0094c768:
      uVar18 = 0;
      bVar6 = false;
    }
    else {
      uVar18 = 0;
      bVar6 = false;
      if (pAVar9->mType == Variable) {
        iVar7 = (*pAVar9->_vptr_AsmJsSymbol[1])(pAVar9);
        uVar18 = 0;
        if ((char)iVar7 != '\0') goto LAB_0094c768;
        pAVar15 = AsmJsVar::FromSymbol(pAVar9);
        bVar6 = (pAVar15->super_AsmJsVarBase).super_AsmJsSymbol.field_0x14 == '\0';
        if (bVar6) {
          uVar18 = (ulong)(uint)(pAVar15->mConstInitialiser).intVal;
          bVar6 = true;
        }
      }
    }
  }
  uVar17 = (uint)uVar18;
  OVar2 = indexNode->nop;
  if ((OVar2 == knopInt) || (OVar2 == knopFlt)) {
    if (!bVar6) {
      if (OVar2 == knopFlt) {
        pPVar12 = ParseNode::AsParseNodeFloat(indexNode);
        if ((pPVar12->field_0x18 & 1) != 0) {
          pPVar12 = ParseNode::AsParseNodeFloat(indexNode);
          uVar18 = 0x80000000;
          if ((pPVar12->dbl == -2147483648.0) && (!NAN(pPVar12->dbl))) goto LAB_0094c8af;
        }
      }
      else if (OVar2 == knopInt) {
        pPVar10 = ParseNode::AsParseNodeInt(indexNode);
        uVar18 = (ulong)(uint)pPVar10->lw;
        goto LAB_0094c8af;
      }
      if ((((indexNode->nop != knopFlt) ||
           (pPVar12 = ParseNode::AsParseNodeFloat(indexNode), (pPVar12->field_0x18 & 1) == 0)) ||
          (pPVar12 = ParseNode::AsParseNodeFloat(indexNode), pPVar12->dbl <= 2147483647.0)) ||
         (pPVar12 = ParseNode::AsParseNodeFloat(indexNode), 4294967295.0 < pPVar12->dbl)) {
        local_58 = Emit(this,indexNode);
        this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        pcVar16 = AsmJsType::toChars(&local_58.type);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_01,L"Array Index must be intish; %s given",pcVar16);
        goto LAB_0094cc48;
      }
      pPVar12 = ParseNode::AsParseNodeFloat(indexNode);
      uVar18 = (ulong)pPVar12->dbl;
    }
  }
  else if (!bVar6) {
    local_48.super_EmitInfoBase.location = 0xffffffff;
    local_48.type.which_ = Void;
    if (TYPE_UINT8 < viewType && OVar2 != knopRsh) {
      this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      AsmJsCompilationException::AsmJsCompilationException
                (this_01,L"index expression isn\'t shifted; must be an Int8/Uint8 access");
      goto LAB_0094cc48;
    }
    if (OVar2 == knopRsh) {
      pPVar11 = ParseNode::AsParseNodeBin(indexNode);
      this_00 = pPVar11->pnode2;
      if ((this_00 == (ParseNode *)0x0) || (this_00->nop != knopInt)) {
        this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_01,L"shift amount must be constant");
        goto LAB_0094cc48;
      }
      if (viewType < TYPE_COUNT) {
        uVar19 = *(uint *)(&DAT_010fdc80 + (ulong)viewType * 4);
        local_34 = *(uint *)(&DAT_010fdcbc + (ulong)viewType * 4);
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                    ,0x63e,"((0))","(0)");
        if (!bVar6) {
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar14 = 0;
        local_34 = 0xffffffff;
        uVar19 = 0;
      }
      pPVar10 = ParseNode::AsParseNodeInt(this_00);
      if (pPVar10->lw != uVar19) {
        this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_01,L"shift amount must be %d",(ulong)uVar19);
        goto LAB_0094cc48;
      }
      pPVar11 = ParseNode::AsParseNodeBin(indexNode);
      indexNode = pPVar11->pnode1;
    }
    else {
      local_34 = 0xffffffff;
    }
    if (indexNode->nop == knopName) {
      pAVar3 = this->mCompiler;
      pIVar8 = ParseNode::name(indexNode);
      bVar6 = false;
      pAVar9 = AsmJsModuleCompiler::LookupIdentifier(pAVar3,pIVar8,this->mFunction,(Source *)0x0);
      if (pAVar9 != (AsmJsSymbol *)0x0) {
        if ((pAVar9->mType != Variable) ||
           (iVar7 = (*pAVar9->_vptr_AsmJsSymbol[1])(pAVar9), (char)iVar7 != '\0'))
        goto LAB_0094ca26;
        pAVar15 = AsmJsVar::FromSymbol(pAVar9);
        bVar6 = (pAVar15->super_AsmJsVarBase).super_AsmJsSymbol.field_0x14 == '\0';
        if (bVar6) {
          uVar17 = (pAVar15->mConstInitialiser).intVal & local_34;
          *(undefined2 *)indexInfo_1 = *(undefined2 *)((long)&typedArrayOp + (ulong)emitType * 4);
          AsmJsModuleCompiler::UpdateMaxHeapAccess(this->mCompiler,uVar17);
          bVar6 = true;
        }
      }
    }
    else {
LAB_0094ca26:
      bVar6 = false;
    }
    if ((indexNode->nop == knopInt) ||
       ((((indexNode->nop == knopFlt &&
          (pPVar12 = ParseNode::AsParseNodeFloat(indexNode), (pPVar12->field_0x18 & 1) != 0)) &&
         (pPVar12 = ParseNode::AsParseNodeFloat(indexNode), 2147483647.0 < pPVar12->dbl)) &&
        (pPVar12 = ParseNode::AsParseNodeFloat(indexNode), pPVar12->dbl <= 4294967295.0)))) {
      uVar17 = ParserWrapper::GetUInt(indexNode);
      uVar17 = uVar17 & local_34;
      *(undefined2 *)indexInfo_1 = *(undefined2 *)((long)&typedArrayOp + (ulong)emitType * 4);
      AsmJsModuleCompiler::UpdateMaxHeapAccess(this->mCompiler,uVar17);
      bVar5 = true;
    }
    else {
      bVar5 = true;
      if (!bVar6) {
        local_48 = Emit(this,indexNode);
        bVar6 = AsmJsType::isIntish(&local_48.type);
        if (!bVar6) {
          this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
          pcVar16 = AsmJsType::toChars(&local_48.type);
          AsmJsCompilationException::AsmJsCompilationException
                    (this_01,L"Left operand of >> must be intish; %s given",pcVar16);
          goto LAB_0094cc48;
        }
        *(RegSlot *)indexInfo = local_48.super_EmitInfoBase.location;
        *(undefined2 *)indexInfo_1 = *(undefined2 *)((long)&typedArrayOp + (ulong)emitType * 4 + 2);
        bVar5 = false;
      }
    }
    if (!bVar5) {
      return local_48;
    }
    goto LAB_0094c91b;
  }
LAB_0094c8af:
  uVar19 = (uint)viewType;
  uVar17 = (uint)uVar18;
  if (uVar19 - 4 < 3) {
    if (0x3fffffff < uVar17) {
      this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      AsmJsCompilationException::AsmJsCompilationException
                (this_01,L"Numeric literal for heap32 must be within 0 <= n < 2^30; %d given",
                 uVar18 & 0xffffffff);
LAB_0094cc48:
      __cxa_throw(this_01,&AsmJsCompilationException::typeinfo,0);
    }
    uVar17 = uVar17 << 2;
  }
  else if (uVar19 - 2 < 2) {
    if ((int)uVar17 < 0) {
      this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      AsmJsCompilationException::AsmJsCompilationException
                (this_01,L"Numeric literal for heap16 must be within 0 <= n < 2^31; %d given",
                 uVar18 & 0xffffffff);
      goto LAB_0094cc48;
    }
    uVar17 = uVar17 * 2;
  }
  else if (uVar19 == 7) {
    if (0x1fffffff < uVar17) {
      this_01 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      AsmJsCompilationException::AsmJsCompilationException
                (this_01,L"Numeric literal for heap64 must be within 0 <= n < 2^29; %d given",
                 uVar18 & 0xffffffff);
      goto LAB_0094cc48;
    }
    uVar17 = uVar17 << 3;
  }
  AsmJsModuleCompiler::UpdateMaxHeapAccess(this->mCompiler,uVar17);
  *(undefined2 *)indexInfo_1 = *(undefined2 *)((long)&typedArrayOp + (ulong)emitType * 4);
LAB_0094c91b:
  *(uint *)indexInfo = uVar17;
  EVar13.super_EmitInfoBase.location = 0xffffffff;
  EVar13.type.which_ = Void;
  return EVar13;
}

Assistant:

EmitExpressionInfo AsmJSByteCodeGenerator::EmitTypedArrayIndex(ParseNode* indexNode, OpCodeAsmJs &op, uint32 &indexSlot, ArrayBufferView::ViewType viewType, TypedArrayEmitType emitType)
    {
        mCompiler->SetUsesHeapBuffer(true);
        bool isConst = false;
        uint32 slot = 0;
        if(indexNode->nop == knopName)
        {
            AsmJsSymbol * declSym = mCompiler->LookupIdentifier(indexNode->name(), mFunction);
            if (AsmJsVar::Is(declSym) && !declSym->isMutable())
            {
                AsmJsVar * definition = AsmJsVar::FromSymbol(declSym);
                if(definition->GetVarType().isInt())
                {
                    slot = (uint32)definition->GetIntInitialiser();
                    isConst = true;
                }
            }
        }
        if (indexNode->nop == knopInt || indexNode->nop == knopFlt || isConst)
        {
            // Emit a different opcode for numerical literal
            if (!isConst)
            {
                if (indexNode->nop == knopInt)
                {
                    slot = (uint32)indexNode->AsParseNodeInt()->lw;
                }
                else if (ParserWrapper::IsMinInt(indexNode))
                {
                    // this is going to be an error, but we can do this to allow it to get same error message as invalid int
                    slot = (uint32)INT32_MIN;
                }
                else if (ParserWrapper::IsUnsigned(indexNode))
                {
                    slot = (uint32)indexNode->AsParseNodeFloat()->dbl;
                }
                else
                {
                    EmitExpressionInfo indexInfo = Emit(indexNode);
                    throw AsmJsCompilationException(_u("Array Index must be intish; %s given"), indexInfo.type.toChars());
                }
            }
            // do the right shift now
            switch( viewType )
            {
            case Js::ArrayBufferView::TYPE_INT16:
            case Js::ArrayBufferView::TYPE_UINT16:
                if (slot & 0x80000000)
                {
                    throw AsmJsCompilationException(_u("Numeric literal for heap16 must be within 0 <= n < 2^31; %d given"), slot);
                }
                slot <<= 1;
                break;
            case Js::ArrayBufferView::TYPE_INT32:
            case Js::ArrayBufferView::TYPE_UINT32:
            case Js::ArrayBufferView::TYPE_FLOAT32:
                if (slot & 0xC0000000)
                {
                    throw AsmJsCompilationException(_u("Numeric literal for heap32 must be within 0 <= n < 2^30; %d given"), slot);
                }
                slot <<= 2;
                break;
            case Js::ArrayBufferView::TYPE_FLOAT64:
                if (slot & 0xE0000000)
                {
                    throw AsmJsCompilationException(_u("Numeric literal for heap64 must be within 0 <= n < 2^29; %d given"), slot);
                }
                slot <<= 3;
                break;
            default:
                break;
            }
            mCompiler->UpdateMaxHeapAccess(slot);
            op = typedArrayOp[emitType][0];
        }
        else
        {
            EmitExpressionInfo indexInfo;
            if (indexNode->nop != knopRsh && viewType != Js::ArrayBufferView::TYPE_INT8 && viewType != Js::ArrayBufferView::TYPE_UINT8)
            {
                throw AsmJsCompilationException( _u("index expression isn't shifted; must be an Int8/Uint8 access") );
            }
            int val = 0;
            uint32 mask = (uint32)~0;
            ParseNode* index;
            if (indexNode->nop == knopRsh)
            {
                ParseNode* rhsNode = ParserWrapper::GetBinaryRight(indexNode);
                if (!rhsNode || rhsNode->nop != knopInt)
                {
                    throw AsmJsCompilationException(_u("shift amount must be constant"));
                }
                switch (viewType)
                {
#define ARRAYBUFFER_VIEW(name, align, RegType, MemType, irSuffix) \
                case Js::ArrayBufferView::TYPE_##name:\
                    val = align;\
                    mask = ARRAYBUFFER_VIEW_MASK(align);\
                    break;
                #include "AsmJsArrayBufferViews.h"
                default:
                    Assume(UNREACHED);
                }
                if (rhsNode->AsParseNodeInt()->lw != val)
                {
                    throw AsmJsCompilationException(_u("shift amount must be %d"), val);
                }
                index = ParserWrapper::GetBinaryLeft(indexNode);
            }
            else
            {
                index = indexNode;
            }

            isConst = false;
            if (index->nop == knopName)
            {
                AsmJsSymbol * declSym = mCompiler->LookupIdentifier(index->name(), mFunction);
                if (AsmJsVar::Is(declSym) && !declSym->isMutable())
                {
                    AsmJsVar * definition = AsmJsVar::FromSymbol(declSym);
                    if (definition->GetVarType().isInt())
                    {
                        slot = (uint32)definition->GetIntInitialiser();
                        slot &= mask;
                        op = typedArrayOp[emitType][0];
                        isConst = true;
                        mCompiler->UpdateMaxHeapAccess(slot);
                    }
                }
            }
            if( ParserWrapper::IsUInt( index) )
            {
                slot = ParserWrapper::GetUInt(index);
                slot &= mask;
                op = typedArrayOp[emitType][0];

                mCompiler->UpdateMaxHeapAccess(slot);
            }
            else if (!isConst)
            {
                indexInfo = Emit( index );
                if( !indexInfo.type.isIntish() )
                {
                    throw AsmJsCompilationException( _u("Left operand of >> must be intish; %s given"), indexInfo.type.toChars() );
                }
                indexSlot = indexInfo.location;
                op = typedArrayOp[emitType][1];
                return indexInfo;
            }
        }
        indexSlot = slot;
        return EmitExpressionInfo();
    }